

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QSocketNotifier::setEnabled(QSocketNotifier *this,bool enable)

{
  QObjectData *pQVar1;
  QObject *pQVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  QThread *pQVar5;
  QThread *pQVar6;
  code *UNRECOVERED_JUMPTABLE;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (((int)pQVar1[1].children.d.size != -1) && ((bool)pQVar1[1].field_0x30 != enable)) {
    pQVar1[1].field_0x30 = enable;
    pQVar2 = pQVar1[1].q_ptr;
    if (pQVar2[6]._vptr_QObject != (_func_int **)0x0) {
      pQVar5 = QObject::thread(&this->super_QObject);
      pQVar6 = QThread::currentThread();
      if (pQVar5 == pQVar6) {
        pp_Var3 = pQVar2[6]._vptr_QObject;
        p_Var4 = *pp_Var3;
        if (pQVar1[1].field_0x30 == '\x01') {
          UNRECOVERED_JUMPTABLE = *(code **)(p_Var4 + 0x68);
        }
        else {
          UNRECOVERED_JUMPTABLE = *(code **)(p_Var4 + 0x70);
        }
        (*UNRECOVERED_JUMPTABLE)(pp_Var3,this);
        return;
      }
      setEnabled();
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }